

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playGround.cpp
# Opt level: O3

void __thiscall PlayGround::PlayGround(PlayGround *this)

{
  (this->p).scream = false;
  (this->p).wumpus = false;
  (this->p).stench = false;
  (this->p).breeze = false;
  (this->p).glitter = false;
  (this->p).bump = false;
  actions::actions(&this->action);
  (this->player)._M_dataplus._M_p = (pointer)&(this->player).field_2;
  (this->player)._M_string_length = 0;
  (this->player).field_2._M_local_buf[0] = '\0';
  (this->direction)._M_dataplus._M_p = (pointer)&(this->direction).field_2;
  (this->direction)._M_string_length = 0;
  (this->direction).field_2._M_local_buf[0] = '\0';
  (this->turn)._M_dataplus._M_p = (pointer)&(this->turn).field_2;
  (this->turn)._M_string_length = 0;
  (this->turn).field_2._M_local_buf[0] = '\0';
  playableWorld::playableWorld(&this->playableworld);
  (this->visiblity).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->visiblity).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->visiblity).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->arrow = 1;
  return;
}

Assistant:

PlayGround::PlayGround()
{
    ;
}